

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnderwaterAcousticFundamentalParameterData.cpp
# Opt level: O3

void __thiscall
KDIS::DATA_TYPE::UnderwaterAcousticFundamentalParameterData::
UnderwaterAcousticFundamentalParameterData(UnderwaterAcousticFundamentalParameterData *this)

{
  DataTypeBase::DataTypeBase(&this->super_DataTypeBase);
  (this->super_DataTypeBase)._vptr_DataTypeBase =
       (_func_int **)&PTR__UnderwaterAcousticFundamentalParameterData_002254e8;
  this->m_ui16AEPI = 0;
  this->m_ui16ScanPattern = 0;
  this->m_f32BeamCenterAzimuth = 0.0;
  this->m_f32AzimuthalBeamWidth = 0.0;
  this->m_f32BeamCenterDE = 0.0;
  this->m_f32DEBeamwidth = 0.0;
  return;
}

Assistant:

UnderwaterAcousticFundamentalParameterData::UnderwaterAcousticFundamentalParameterData() :
    m_ui16AEPI( 0 ),
    m_ui16ScanPattern( 0 ),
    m_f32BeamCenterAzimuth( 0 ),
    m_f32AzimuthalBeamWidth( 0 ),
    m_f32BeamCenterDE( 0 ),
    m_f32DEBeamwidth( 0 )
{
}